

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O2

void __thiscall
OpenMD::ZConstraintForceModifier::ZConstraintForceModifier
          (ZConstraintForceModifier *this,SimInfo *info)

{
  _Rb_tree_header *p_Var1;
  int index;
  Globals *pGVar2;
  Snapshot *this_00;
  pointer ppZVar3;
  pointer ppZVar4;
  SimInfo *info_00;
  RealType RVar5;
  undefined1 uVar6;
  ZConsStamp *pZVar7;
  ZConsWriter *this_01;
  double *pdVar8;
  ulong uVar9;
  ulong uVar10;
  pointer ppMVar11;
  ulong uVar12;
  bool bVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  double dVar16;
  allocator<char> local_e1;
  double local_e0;
  string local_d8;
  vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_> stamp;
  Mat3x3d hmat;
  
  (this->super_ForceModifier).info_ = info;
  (this->super_ForceModifier)._vptr_ForceModifier =
       (_func_int **)&PTR__ZConstraintForceModifier_002c63a8;
  (this->movingZMols_).
  super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->movingZMols_;
  (this->movingZMols_).
  super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->movingZMols_;
  (this->movingZMols_).
  super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>._M_impl._M_node.
  _M_size = 0;
  (this->fixedZMols_).
  super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->fixedZMols_;
  (this->fixedZMols_).
  super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->fixedZMols_;
  (this->fixedZMols_).
  super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>._M_impl._M_node.
  _M_size = 0;
  (this->unzconsMols_).super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->unzconsMols_).super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->unzconsMols_).super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->zconsOutput_)._M_dataplus._M_p = (pointer)&(this->zconsOutput_).field_2;
  (this->zconsOutput_)._M_string_length = 0;
  (this->zconsOutput_).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->allZMolIndices_)._M_t._M_impl.super__Rb_tree_header;
  (this->allZMolIndices_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->allZMolIndices_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->allZMolIndices_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->allZMolIndices_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->allZMolIndices_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->infiniteTime = 1e+31;
  pGVar2 = info->simParams_;
  this_00 = info->sman_->currentSnapshot_;
  this->currSnapshot_ = this_00;
  RVar5 = Snapshot::getTime(this_00);
  this->currZconsTime_ = RVar5;
  if ((pGVar2->Dt).super_ParameterBase.empty_ == false) {
    this->dt_ = (pGVar2->Dt).data_;
  }
  else {
    builtin_strncpy(painCave.errMsg + 0x20,"t is not set\n",0xe);
    builtin_strncpy(painCave.errMsg + 0x10,"Manager Error: d",0x10);
    builtin_strncpy(painCave.errMsg,"ZconstraintForce",0x10);
    painCave.isFatal = 1;
    simError();
  }
  if ((pGVar2->ZconsTime).super_ParameterBase.empty_ == false) {
    this->zconsTime_ = (pGVar2->ZconsTime).data_;
  }
  else {
    memcpy(&painCave,
           "ZconstraintForceManager error: If you use a ZConstraint,\n\tyou must set zconsTime.\n",
           0x53);
    painCave.isFatal = 1;
    simError();
  }
  if ((pGVar2->ZconsTol).super_ParameterBase.empty_ == false) {
    this->zconsTol_ = (pGVar2->ZconsTol).data_;
  }
  else {
    this->zconsTol_ = 0.01;
    snprintf(painCave.errMsg,2000,
             "ZconstraintForceManager Warning: Tolerance for z-constraint method is not specified.\n\tOpenMD will use a default value of %f.\n\tTo set the tolerance, use the zconsTol variable.\n"
             ,0x47ae147b);
    painCave.isFatal = 0;
    simError();
  }
  bVar13 = (pGVar2->ZconsGap).super_ParameterBase.empty_ == false;
  if (bVar13) {
    dVar16 = (pGVar2->ZconsGap).data_;
    uVar14 = SUB84(dVar16,0);
    uVar15 = (undefined4)((ulong)dVar16 >> 0x20);
  }
  else {
    uVar14 = 0;
    uVar15 = 0;
  }
  this->usingZconsGap_ = bVar13;
  this->zconsGap_ = (RealType)CONCAT44(uVar15,uVar14);
  pdVar8 = &(pGVar2->ZconsFixtime).data_;
  if ((pGVar2->ZconsFixtime).super_ParameterBase.empty_ != false) {
    pdVar8 = &this->infiniteTime;
  }
  this->zconsFixingTime_ = *pdVar8;
  if ((pGVar2->ZconsUsingSMD).super_ParameterBase.empty_ == false) {
    uVar6 = (pGVar2->ZconsUsingSMD).super_ParameterBase.field_0x2b;
  }
  else {
    uVar6 = false;
  }
  this->usingSMD_ = (bool)uVar6;
  std::__cxx11::string::string
            ((string *)&stamp,(string *)&((this->super_ForceModifier).info_)->finalConfigFileName_);
  getPrefix(&local_d8,(string *)&stamp);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&hmat,
                 &local_d8,".fz");
  std::__cxx11::string::operator=((string *)&this->zconsOutput_,(string *)&hmat);
  std::__cxx11::string::~string((string *)&hmat);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&stamp);
  Snapshot::getHmat(&hmat,this->currSnapshot_);
  if (hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] <=
      hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1]) {
    hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] =
         hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1];
  }
  if ((pGVar2->TargetTemp).super_ParameterBase.empty_ == false) {
    local_e0 = (pGVar2->TargetTemp).data_ * 0.0019872156;
  }
  else {
    local_e0 = 0.5921902487999999;
  }
  dVar16 = hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2];
  if (hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] <=
      hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0]) {
    dVar16 = hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
  }
  ppZVar3 = (pGVar2->zconstraints_).
            super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppZVar4 = (pGVar2->zconstraints_).
            super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  std::vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>::vector
            (&stamp,&pGVar2->zconstraints_);
  local_e0 = local_e0 / (dVar16 * 0.5 * dVar16 * 0.5);
  uVar9 = (ulong)((long)ppZVar4 - (long)ppZVar3) >> 3;
  uVar12 = 0;
  uVar10 = uVar9 & 0xffffffff;
  if ((int)uVar9 < 1) {
    uVar10 = uVar12;
  }
  for (; uVar10 != uVar12; uVar12 = uVar12 + 1) {
    pZVar7 = stamp.super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar12];
    index = *(int *)&(pZVar7->MolIndex).super_ParameterBase.field_0x2c;
    if ((pZVar7->Zpos).super_ParameterBase.empty_ == false) {
      dVar16 = (pZVar7->Zpos).data_;
      uVar14 = SUB84(dVar16,0);
      uVar15 = (undefined4)((ulong)dVar16 >> 0x20);
    }
    else {
      RVar5 = getZTargetPos(this,index);
      uVar14 = SUB84(RVar5,0);
      uVar15 = (undefined4)((ulong)RVar5 >> 0x20);
      pZVar7 = stamp.super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar12];
    }
    local_d8.field_2._8_8_ = 0.0;
    if ((pZVar7->CantVel).super_ParameterBase.empty_ == false) {
      local_d8.field_2._8_8_ = (pZVar7->CantVel).data_;
    }
    local_d8.field_2._M_allocated_capacity = (size_type)((pZVar7->Kratio).data_ * local_e0);
    local_d8._M_string_length = CONCAT44(uVar15,uVar14);
    local_d8._M_dataplus._M_p._0_4_ = index;
    std::
    _Rb_tree<int,std::pair<int_const,OpenMD::ZconstraintParam>,std::_Select1st<std::pair<int_const,OpenMD::ZconstraintParam>>,std::less<int>,std::allocator<std::pair<int_const,OpenMD::ZconstraintParam>>>
    ::_M_emplace_unique<std::pair<int,OpenMD::ZconstraintParam>>
              ((_Rb_tree<int,std::pair<int_const,OpenMD::ZconstraintParam>,std::_Select1st<std::pair<int_const,OpenMD::ZconstraintParam>>,std::less<int>,std::allocator<std::pair<int_const,OpenMD::ZconstraintParam>>>
                *)&this->allZMolIndices_,(pair<int,_OpenMD::ZconstraintParam> *)&local_d8);
  }
  update(this);
  this->totMassUnconsMols_ = 0.0;
  for (ppMVar11 = (this->unzconsMols_).
                  super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      ppMVar11 !=
      (this->unzconsMols_).
      super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppMVar11 = ppMVar11 + 1) {
    RVar5 = Molecule::getMass(*ppMVar11);
    this->totMassUnconsMols_ = RVar5 + this->totMassUnconsMols_;
  }
  zeroVelocity(this);
  this_01 = (ZConsWriter *)operator_new(0x208);
  info_00 = (this->super_ForceModifier).info_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,(this->zconsOutput_)._M_dataplus._M_p,&local_e1);
  ZConsWriter::ZConsWriter(this_01,info_00,&local_d8);
  this->fzOut = this_01;
  std::__cxx11::string::~string((string *)&local_d8);
  if (this->fzOut == (ZConsWriter *)0x0) {
    builtin_strncpy(painCave.errMsg,"ZconstraintForceManager:: Failed to create ZConsWriter\n",0x38)
    ;
    painCave.isFatal = 1;
    simError();
  }
  std::_Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>::~_Vector_base
            (&stamp.super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>)
  ;
  return;
}

Assistant:

ZConstraintForceModifier::ZConstraintForceModifier(SimInfo* info) :
      ForceModifier {info}, infiniteTime {1e31} {
    Globals* simParam = info_->getSimParams();
    currSnapshot_     = info_->getSnapshotManager()->getCurrentSnapshot();
    currZconsTime_    = currSnapshot_->getTime();

    if (simParam->haveDt()) {
      dt_ = simParam->getDt();
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ZconstraintForceManager Error: dt is not set\n");
      painCave.isFatal = 1;
      simError();
    }

    if (simParam->haveZconsTime()) {
      zconsTime_ = simParam->getZconsTime();
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ZconstraintForceManager error: If you use a ZConstraint,\n"
               "\tyou must set zconsTime.\n");
      painCave.isFatal = 1;
      simError();
    }

    if (simParam->haveZconsTol()) {
      zconsTol_ = simParam->getZconsTol();
    } else {
      zconsTol_ = 0.01;
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ZconstraintForceManager Warning: Tolerance for z-constraint "
               "method is not specified.\n"
               "\tOpenMD will use a default value of %f.\n"
               "\tTo set the tolerance, use the zconsTol variable.\n",
               zconsTol_);
      painCave.isFatal = 0;
      simError();
    }

    // set zcons gap
    if (simParam->haveZconsGap()) {
      usingZconsGap_ = true;
      zconsGap_      = simParam->getZconsGap();
    } else {
      usingZconsGap_ = false;
      zconsGap_      = 0.0;
    }

    // set zcons fixtime
    if (simParam->haveZconsFixtime()) {
      zconsFixingTime_ = simParam->getZconsFixtime();
    } else {
      zconsFixingTime_ = infiniteTime;
    }

    // set zconsUsingSMD
    if (simParam->haveZconsUsingSMD()) {
      usingSMD_ = simParam->getZconsUsingSMD();
    } else {
      usingSMD_ = false;
    }

    zconsOutput_ = getPrefix(info_->getFinalConfigFileName()) + ".fz";

    // estimate the force constant of harmonical potential
    Mat3x3d hmat = currSnapshot_->getHmat();
    RealType halfOfLargestBox =
        std::max(hmat(0, 0), std::max(hmat(1, 1), hmat(2, 2))) / 2;
    RealType targetTemp;
    if (simParam->haveTargetTemp()) {
      targetTemp = simParam->getTargetTemp();
    } else {
      targetTemp = 298.0;
    }
    RealType zforceConstant =
        Constants::kb * targetTemp / (halfOfLargestBox * halfOfLargestBox);

    int nZconstraints              = simParam->getNZconsStamps();
    std::vector<ZConsStamp*> stamp = simParam->getZconsStamps();

    for (int i = 0; i < nZconstraints; i++) {
      ZconstraintParam param;
      int zmolIndex = stamp[i]->getMolIndex();
      if (stamp[i]->haveZpos()) {
        param.zTargetPos = stamp[i]->getZpos();
      } else {
        param.zTargetPos = getZTargetPos(zmolIndex);
      }

      param.kz = zforceConstant * stamp[i]->getKratio();

      if (stamp[i]->haveCantVel()) {
        param.cantVel = stamp[i]->getCantVel();
      } else {
        param.cantVel = 0.0;
      }

      allZMolIndices_.insert(std::make_pair(zmolIndex, param));
    }

    // create fixedMols_, movingMols_ and unconsMols lists
    update();

    // calculate mass of unconstrained molecules in the whole system
    // (never changes during the simulation)

    totMassUnconsMols_ = 0.0;
    std::vector<Molecule*>::iterator j;
    for (j = unzconsMols_.begin(); j != unzconsMols_.end(); ++j) {
      totMassUnconsMols_ += (*j)->getMass();
    }
#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &totMassUnconsMols_, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
#endif

    // Zero out the velocities of center of mass of unconstrained
    // molecules and the velocities of center of mass of every single
    // z-constrained molecueles
    zeroVelocity();

    // create zconsWriter
    fzOut = new ZConsWriter(info_, zconsOutput_.c_str());

    if (!fzOut) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ZconstraintForceManager:: Failed to create ZConsWriter\n");
      painCave.isFatal = 1;
      simError();
    }
  }